

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_log.cpp
# Opt level: O3

void __thiscall
duckdb::WriteLogBindData::WriteLogBindData(WriteLogBindData *this,WriteLogBindData *other)

{
  idx_t iVar1;
  
  (this->super_FunctionData)._vptr_FunctionData = (_func_int **)&PTR__WriteLogBindData_01983060;
  this->disable_logging = false;
  (this->scope)._M_dataplus._M_p = (pointer)&(this->scope).field_2;
  (this->scope)._M_string_length = 0;
  (this->scope).field_2._M_local_buf[0] = '\0';
  this->level = LOG_INFO;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  (this->context).ptr = (ClientContext *)0x0;
  this->output_col = 0xffffffffffffffff;
  LogicalType::LogicalType(&this->return_type);
  this->disable_logging = other->disable_logging;
  ::std::__cxx11::string::_M_assign((string *)&this->scope);
  this->level = other->level;
  ::std::__cxx11::string::_M_assign((string *)&this->type);
  iVar1 = other->output_col;
  (this->context).ptr = (other->context).ptr;
  this->output_col = iVar1;
  if (this != other) {
    (this->return_type).id_ = (other->return_type).id_;
    (this->return_type).physical_type_ = (other->return_type).physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(this->return_type).type_info_,&(other->return_type).type_info_);
    return;
  }
  return;
}

Assistant:

WriteLogBindData(const WriteLogBindData &other) {
		disable_logging = other.disable_logging;
		scope = other.scope;
		level = other.level;
		type = other.type;

		context = other.context;

		output_col = other.output_col;
		return_type = other.return_type;
	}